

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserequationast.cpp
# Opt level: O2

void __thiscall libcellml::AnalyserEquationAst::AnalyserEquationAst(AnalyserEquationAst *this)

{
  AnalyserEquationAstImpl *pAVar1;
  
  pAVar1 = (AnalyserEquationAstImpl *)operator_new(0x88);
  *(undefined8 *)pAVar1 = 0;
  (pAVar1->mValue)._M_dataplus._M_p = (pointer)0x0;
  (pAVar1->mValue)._M_string_length = 0;
  (pAVar1->mValue).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pAVar1->mValue).field_2 + 8) = 0;
  (pAVar1->mValue)._M_dataplus._M_p = (pointer)&(pAVar1->mValue).field_2;
  (pAVar1->mValue).field_2._M_local_buf[0] = '\0';
  (pAVar1->mVariable).super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pAVar1->mVariable).super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pAVar1->mParent).super___weak_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (pAVar1->mParent).super___weak_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pAVar1->mOwnedLeftChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pAVar1->mOwnedLeftChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pAVar1->mOwnedRightChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pAVar1->mOwnedRightChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pAVar1->mLeftChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pAVar1->mLeftChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pAVar1->mRightChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pAVar1->mRightChild).
  super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mPimpl = pAVar1;
  return;
}

Assistant:

AnalyserEquationAst::AnalyserEquationAst()
    : mPimpl(new AnalyserEquationAstImpl())
{
}